

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall ser::CentralizedFileFormat::CleanTables(CentralizedFileFormat *this)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_360 [32];
  ostringstream local_340 [8];
  ostringstream fname;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream fname_1;
  _Self local_20;
  _Self local_18;
  const_iterator iter;
  CentralizedFileFormat *this_local;
  
  iter._M_node = (_Base_ptr)this;
  (*(this->super_FileFormat)._vptr_FileFormat[3])();
  local_18._M_node =
       (_Base_ptr)FieldsTable::begin_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)FieldsTable::end_abi_cxx11_((this->super_FileFormat).pFieldsTable_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,(string *)&(this->super_FileFormat).directory_);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = std::operator<<(poVar4,(string *)&(this->super_FileFormat).prefix_);
    poVar4 = std::operator<<(poVar4,"_");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
             ::operator->(&local_18);
    psVar3 = DataFieldInfo::name_abi_cxx11_(&ppVar2->second);
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4,".dat");
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    remove(pcVar5);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
    ::operator++(&local_18);
  }
  std::__cxx11::ostringstream::ostringstream(local_340);
  poVar4 = std::operator<<((ostream *)local_340,(string *)&(this->super_FileFormat).directory_);
  poVar4 = std::operator<<(poVar4,"/");
  poVar4 = std::operator<<(poVar4,(string *)&(this->super_FileFormat).prefix_);
  std::operator<<(poVar4,".dat");
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  remove(pcVar5);
  std::__cxx11::string::~string(local_360);
  MetainfoSet::Cleanup((this->super_FileFormat).pGlobalMetainfo_);
  FieldsTable::Cleanup((this->super_FileFormat).pFieldsTable_);
  OffsetTable::Cleanup((this->super_FileFormat).pOffsetTable_);
  std::__cxx11::ostringstream::~ostringstream(local_340);
  return;
}

Assistant:

void CentralizedFileFormat::CleanTables()
{
    // Import tables to get list of files
    ImportTables();

    // Remove data files
    for (FieldsTable::const_iterator iter = pFieldsTable_->begin(); iter != pFieldsTable_->end(); ++iter)
    {
        std::ostringstream fname;
        fname << directory_ << "/" << prefix_ << "_" << iter->second.name() << ".dat";
        std::remove(fname.str().c_str());
    }

    // Remove database file
    std::ostringstream fname;
    fname << directory_ << "/" << prefix_ << ".dat";
    std::remove(fname.str().c_str());

    // Clean tables
    pGlobalMetainfo_->Cleanup();
    pFieldsTable_->Cleanup();
    pOffsetTable_->Cleanup();
}